

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverpointSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverpointSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::DataTypeSyntax&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          DataTypeSyntax *args_1,NamedLabelSyntax **args_2,Token *args_3,ExpressionSyntax *args_4,
          CoverageIffClauseSyntax **args_5,Token *args_6,
          SyntaxList<slang::syntax::MemberSyntax> *args_7,Token *args_8,Token *args_9)

{
  Token openBrace;
  Token closeBrace;
  Token emptySemi;
  CoverpointSyntax *pCVar1;
  Info *in_RCX;
  SyntaxList<slang::syntax::MemberSyntax> *in_RDX;
  undefined8 unaff_RBX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  CoverageIffClauseSyntax *in_R9;
  Info *unaff_R14;
  Token *in_stack_00000010;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  
  pCVar1 = (CoverpointSyntax *)
           allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  openBrace.info = in_RCX;
  openBrace.kind = (short)in_R8;
  openBrace._2_1_ = (char)((ulong)in_R8 >> 0x10);
  openBrace.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  openBrace.rawLen = (int)((ulong)in_R8 >> 0x20);
  closeBrace.info = in_RDI;
  closeBrace.kind = (short)in_RSI;
  closeBrace._2_1_ = (char)((ulong)in_RSI >> 0x10);
  closeBrace.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  closeBrace.rawLen = (int)((ulong)in_RSI >> 0x20);
  emptySemi.info = unaff_R14;
  emptySemi.kind = (short)unaff_RBX;
  emptySemi._2_1_ = (char)((ulong)unaff_RBX >> 0x10);
  emptySemi.numFlags.raw = (char)((ulong)unaff_RBX >> 0x18);
  emptySemi.rawLen = (int)((ulong)unaff_RBX >> 0x20);
  slang::syntax::CoverpointSyntax::CoverpointSyntax
            ((CoverpointSyntax *)in_stack_00000020[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000020,
             (DataTypeSyntax *)in_stack_00000028[1],(NamedLabelSyntax *)*in_stack_00000028,
             *in_stack_00000010,*(ExpressionSyntax **)(in_R8 + 8),in_R9,openBrace,in_RDX,closeBrace,
             emptySemi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }